

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FenceVkImpl.cpp
# Opt level: O2

Uint64 __thiscall Diligent::FenceVkImpl::InternalGetCompletedValue(FenceVkImpl *this)

{
  VulkanLogicalDevice *this_00;
  _Elt_pointer pSVar1;
  VkResult VVar2;
  char (*in_RCX) [23];
  SyncPointData *Item;
  string msg;
  string local_40;
  
  if ((this->m_TimelineSemaphore).m_VkObject != (VkSemaphore_T *)0x0) {
    FormatString<char[26],char[23]>
              (&local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"!IsTimelineSemaphore()",in_RCX);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"InternalGetCompletedValue",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
               ,0x81);
    std::__cxx11::string::~string((string *)&local_40);
  }
  this_00 = (((this->super_FenceBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
             .m_pDevice)->m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  while (pSVar1 = (this->m_SyncPoints).
                  super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur,
        (this->m_SyncPoints).
        super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur != pSVar1) {
    VVar2 = VulkanUtilities::VulkanLogicalDevice::GetFenceStatus
                      (this_00,(((pSVar1->SyncPoint).
                                 super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->m_Fence).m_VkSyncObject);
    if (VVar2 != VK_SUCCESS) break;
    FenceBase<Diligent::EngineVkImplTraits>::UpdateLastCompletedFenceValue
              (&this->super_FenceBase<Diligent::EngineVkImplTraits>,pSVar1->Value);
    std::
    deque<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
    ::pop_front(&this->m_SyncPoints);
  }
  return (this->super_FenceBase<Diligent::EngineVkImplTraits>).m_LastCompletedFenceValue.
         super___atomic_base<unsigned_long>._M_i;
}

Assistant:

Uint64 FenceVkImpl::InternalGetCompletedValue()
{
    VERIFY_EXPR(!IsTimelineSemaphore());

    const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = m_pDevice->GetLogicalDevice();
    while (!m_SyncPoints.empty())
    {
        SyncPointData& Item = m_SyncPoints.front();

        VkResult status = LogicalDevice.GetFenceStatus(Item.SyncPoint->GetFence());
        if (status == VK_SUCCESS)
        {
            UpdateLastCompletedFenceValue(Item.Value);
            m_SyncPoints.pop_front();
        }
        else
        {
            break;
        }
    }

    return m_LastCompletedFenceValue.load();
}